

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserFontEffect.cpp
# Opt level: O1

bool __thiscall
Rml::PropertyParserFontEffect::ParseValue
          (PropertyParserFontEffect *this,Property *property,String *font_effect_string_value,
          ParameterMap *param_3)

{
  NodePtr pDVar1;
  ulong uVar2;
  size_type sVar3;
  shared_ptr<const_Rml::FontEffect> *psVar4;
  ulong *puVar5;
  shared_ptr<const_Rml::FontEffect> *psVar6;
  bool bVar7;
  int iVar8;
  Layer LVar9;
  ulong uVar10;
  ulong uVar11;
  FontEffectInstancer *this_00;
  PropertySpecification *this_01;
  PropertyMap *this_02;
  long lVar13;
  element_type *peVar14;
  uint8_t *puVar15;
  ulong *puVar16;
  pair<Rml::PropertyId,_Rml::Property> *id_value;
  pointer pbVar17;
  __normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>
  __seed;
  undefined1 auVar18 [8];
  const_iterator cVar19;
  String type;
  FontEffects font_effects;
  SharedPtr<FontEffect> font_effect;
  PropertyDictionary properties;
  String shorthand;
  StringList font_effect_string_list;
  String local_138;
  String local_118;
  undefined1 local_f8 [8];
  shared_ptr<const_Rml::FontEffect> *psStack_f0;
  pointer local_e8;
  undefined1 *local_e0;
  _func_int **local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  _func_int **pp_Stack_c8;
  shared_ptr<Rml::FontEffect> local_b8;
  undefined1 local_a8 [48];
  String local_78;
  StringList local_58;
  pointer local_40;
  FontEffect *local_38;
  NodePtr pDVar12;
  
  if ((font_effect_string_value->_M_string_length == 0) ||
     (iVar8 = ::std::__cxx11::string::compare((char *)font_effect_string_value), iVar8 == 0)) {
    Variant::Variant((Variant *)local_f8);
    Variant::operator=(&property->value,(Variant *)local_f8);
    Variant::~Variant((Variant *)local_f8);
    property->unit = UNKNOWN;
    return true;
  }
  local_e0 = &local_d0;
  local_f8 = (undefined1  [8])0x0;
  psStack_f0 = (shared_ptr<const_Rml::FontEffect> *)0x0;
  local_e8 = (pointer)0x0;
  local_d8 = (_func_int **)0x0;
  local_d0 = 0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  StringUtilities::ExpandString(&local_58,font_effect_string_value,',','(',')',false);
  ::std::__cxx11::string::_M_assign((string *)&local_e0);
  ::std::
  vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
  ::reserve((vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
             *)local_f8,
            (long)local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_40 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar17 = local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar10 = ::std::__cxx11::string::find((char)pbVar17,0x28);
      uVar11 = ::std::__cxx11::string::rfind((char)pbVar17,0x29);
      if ((uVar11 <= uVar10) || (uVar11 == 0xffffffffffffffff)) {
        bVar7 = false;
        Log::Message(LT_WARNING,"Invalid syntax for font-effect \'%s\'.",(pbVar17->_M_dataplus)._M_p
                    );
        goto LAB_0025a028;
      }
      ::std::__cxx11::string::substr((ulong)local_a8,(ulong)pbVar17);
      StringUtilities::StripWhitespace(&local_138,(String *)local_a8);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      this_00 = Factory::GetFontEffectInstancer(&local_138);
      if (this_00 == (FontEffectInstancer *)0x0) {
        Log::Message(LT_WARNING,"Font-effect type \'%s\' not found.",local_138._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_00259e59:
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
LAB_00259e66:
        bVar7 = false;
        goto LAB_0025a028;
      }
      ::std::__cxx11::string::substr((ulong)&local_78,(ulong)pbVar17);
      this_01 = FontEffectInstancer::GetPropertySpecification(this_00);
      PropertyDictionary::PropertyDictionary((PropertyDictionary *)local_a8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"font-effect","");
      bVar7 = PropertySpecification::ParsePropertyDeclaration
                        (this_01,(PropertyDictionary *)local_a8,&local_118,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (!bVar7) {
        StringUtilities::StripWhitespace(&local_118,&local_78);
        sVar3 = local_118._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (sVar3 != 0) {
          Log::Message(LT_WARNING,"Could not parse font-effect value \'%s\'.",
                       (pbVar17->_M_dataplus)._M_p);
          robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     *)local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) goto LAB_00259e59;
          goto LAB_00259e66;
        }
      }
      PropertySpecification::SetPropertyDefaults(this_01,(PropertyDictionary *)local_a8);
      (*this_00->_vptr_FontEffectInstancer[2])(&local_b8,this_00,&local_138,(String *)local_a8);
      peVar14 = local_b8.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_b8.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (FontEffect *)0x0) {
        Log::Message(LT_WARNING,"Font-effect \'%s\' could not be instanced.",
                     (pbVar17->_M_dataplus)._M_p);
      }
      else {
        local_38 = local_b8.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar10 = ::std::_Hash_bytes(local_138._M_dataplus._M_p,local_138._M_string_length,0xc70f6907
                                   );
        this_02 = PropertyDictionary::GetProperties((PropertyDictionary *)local_a8);
        cVar19 = robin_hood::detail::
                 Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 ::cbegin(this_02);
        pDVar12 = cVar19.mKeyVals;
        pDVar1 = (NodePtr)this_02->mInfo;
        while (pDVar12 != pDVar1) {
          puVar15 = cVar19.mInfo;
          Property::Get<std::__cxx11::string>(&local_118,&((cVar19.mKeyVals)->mData).second);
          lVar13 = ::std::_Hash_bytes(local_118._M_dataplus._M_p,local_118._M_string_length,
                                      0xc70f6907);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          pDVar12 = cVar19.mKeyVals + 1;
          uVar11 = *(ulong *)(puVar15 + 1);
          if (uVar11 == 0) {
            puVar5 = (ulong *)(puVar15 + 9);
            do {
              puVar16 = puVar5;
              pDVar12 = pDVar12 + 8;
              uVar11 = *puVar16;
              puVar5 = puVar16 + 1;
            } while (uVar11 == 0);
          }
          else {
            puVar16 = (ulong *)(puVar15 + 1);
          }
          uVar10 = (uVar10 >> 2) + uVar10 * 0x40 + 0x9e3779b9 + lVar13 ^ uVar10;
          uVar2 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          uVar11 = uVar2 >> 3 & 0x1fffffff;
          pDVar12 = pDVar12 + uVar11;
          cVar19.mInfo = (uint8_t *)((long)puVar16 + uVar11);
          cVar19.mKeyVals = pDVar12;
        }
        FontEffect::SetFingerprint
                  (local_b8.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   uVar10);
        peVar14 = local_38;
        ::std::
        vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>
        ::emplace_back<std::shared_ptr<Rml::FontEffect>>
                  ((vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>
                    *)local_f8,&local_b8);
      }
      if (local_b8.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      robin_hood::detail::
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                 *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (peVar14 == (FontEffect *)0x0) goto LAB_00259dff;
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != local_40);
  }
  psVar4 = psStack_f0;
  if (local_f8 == (undefined1  [8])psStack_f0) {
LAB_00259dff:
    bVar7 = false;
    goto LAB_0025a028;
  }
  lVar13 = (long)psStack_f0 - (long)local_f8 >> 6;
  auVar18 = local_f8;
  if (0 < lVar13) {
    lVar13 = lVar13 + 1;
    psVar6 = (shared_ptr<const_Rml::FontEffect> *)((long)local_f8 + 0x20);
    do {
      __seed._M_current = psVar6;
      LVar9 = FontEffect::GetLayer
                        (__seed._M_current[-2].
                         super___shared_ptr<const_Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (LVar9 != Back) {
        __seed._M_current = __seed._M_current + -2;
        goto LAB_00259ee0;
      }
      LVar9 = FontEffect::GetLayer
                        (__seed._M_current[-1].
                         super___shared_ptr<const_Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (LVar9 != Back) {
        __seed._M_current = __seed._M_current + -1;
        goto LAB_00259ee0;
      }
      LVar9 = FontEffect::GetLayer
                        (((__seed._M_current)->
                         super___shared_ptr<const_Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      if (LVar9 != Back) goto LAB_00259ee0;
      LVar9 = FontEffect::GetLayer
                        (__seed._M_current[1].
                         super___shared_ptr<const_Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (LVar9 != Back) {
        __seed._M_current = __seed._M_current + 1;
        goto LAB_00259ee0;
      }
      lVar13 = lVar13 + -1;
      psVar6 = __seed._M_current + 4;
    } while (1 < lVar13);
    auVar18 = (undefined1  [8])(__seed._M_current + 2);
  }
  lVar13 = (long)psVar4 - (long)auVar18 >> 4;
  if (lVar13 == 1) {
LAB_00259dba:
    LVar9 = FontEffect::GetLayer
                      ((((shared_ptr<const_Rml::FontEffect> *)auVar18)->
                       super___shared_ptr<const_Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      );
    __seed._M_current = (shared_ptr<const_Rml::FontEffect> *)auVar18;
    if (LVar9 == Back) {
      __seed._M_current = psVar4;
    }
  }
  else if (lVar13 == 2) {
LAB_00259daa:
    LVar9 = FontEffect::GetLayer
                      ((((shared_ptr<const_Rml::FontEffect> *)auVar18)->
                       super___shared_ptr<const_Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      );
    __seed._M_current = (shared_ptr<const_Rml::FontEffect> *)auVar18;
    if (LVar9 == Back) {
      auVar18 = (undefined1  [8])((long)auVar18 + 0x10);
      goto LAB_00259dba;
    }
  }
  else {
    __seed._M_current = psVar4;
    if ((lVar13 == 3) &&
       (LVar9 = FontEffect::GetLayer
                          ((((shared_ptr<const_Rml::FontEffect> *)auVar18)->
                           super___shared_ptr<const_Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr), __seed._M_current = (shared_ptr<const_Rml::FontEffect> *)auVar18
       , LVar9 == Back)) {
      auVar18 = (undefined1  [8])((long)auVar18 + 0x10);
      goto LAB_00259daa;
    }
  }
LAB_00259ee0:
  if (__seed._M_current != psVar4) {
    ::std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>,_std::shared_ptr<const_Rml::FontEffect>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>,_std::shared_ptr<const_Rml::FontEffect>_>
                         *)local_a8,__seed,(long)psVar4 - (long)__seed._M_current >> 4);
    ::std::
    __stable_partition_adaptive<__gnu_cxx::__normal_iterator<std::shared_ptr<Rml::FontEffect_const>*,std::vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>>,std::shared_ptr<Rml::FontEffect_const>*,__gnu_cxx::__ops::_Iter_pred<Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::__0>,long>
              (__seed._M_current,psVar4,local_a8._0_8_,local_a8._16_8_,local_a8._8_8_);
    ::std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>,_std::shared_ptr<const_Rml::FontEffect>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::shared_ptr<const_Rml::FontEffect>_*,_std::vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>_>,_std::shared_ptr<const_Rml::FontEffect>_>
                *)local_a8);
  }
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = (size_type)operator_new(0x48);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_003371a8;
  local_138._M_dataplus._M_p = (pointer)(local_138._M_string_length + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)local_f8;
  *(shared_ptr<const_Rml::FontEffect> **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x10))->
    _M_use_count = psStack_f0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)local_e8;
  local_f8 = (undefined1  [8])0x0;
  psStack_f0 = (shared_ptr<const_Rml::FontEffect> *)0x0;
  local_e8 = (pointer)0x0;
  *(_Atomic_word **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x20))->
    _M_use_count =
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x30))->
        _M_use_count;
  if (local_e0 == &local_d0) {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x30))->
    _M_use_count = (int)CONCAT71(uStack_cf,local_d0);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x30))->
    _M_weak_count = (int)((uint7)uStack_cf >> 0x18);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x40))->
    _vptr__Sp_counted_base = pp_Stack_c8;
  }
  else {
    *(undefined1 **)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x20))->
      _M_use_count = local_e0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x30))->
    _M_use_count = (int)CONCAT71(uStack_cf,local_d0);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x30))->
    _M_weak_count = (int)((uint7)uStack_cf >> 0x18);
  }
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_string_length + 0x30))->
  _vptr__Sp_counted_base = local_d8;
  local_d8 = (_func_int **)0x0;
  local_d0 = 0;
  local_e0 = &local_d0;
  Variant::Variant<std::shared_ptr<Rml::FontEffects>,void>
            ((Variant *)local_a8,(shared_ptr<Rml::FontEffects> *)&local_138);
  Variant::operator=(&property->value,(Variant *)local_a8);
  Variant::~Variant((Variant *)local_a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
  }
  property->unit = FONTEFFECT;
  bVar7 = true;
LAB_0025a028:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  ::std::
  vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
  ::~vector((vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
             *)local_f8);
  return bVar7;
}

Assistant:

bool PropertyParserFontEffect::ParseValue(Property& property, const String& font_effect_string_value, const ParameterMap& /*parameters*/) const
{
	// Font-effects are declared as
	//   font-effect: <font-effect-value>[, <font-effect-value> ...];
	// Where <font-effect-value> is declared with inline properties, e.g.
	//   font-effect: outline( 1px black ), ...;

	if (font_effect_string_value.empty() || font_effect_string_value == "none")
	{
		property.value = Variant();
		property.unit = Unit::UNKNOWN;
		return true;
	}

	RMLUI_ZoneScoped;

	FontEffects font_effects;

	// Make sure we don't split inside the parenthesis since they may appear in decorator shorthands.
	StringList font_effect_string_list;
	StringUtilities::ExpandString(font_effect_string_list, font_effect_string_value, ',', '(', ')');

	font_effects.value = font_effect_string_value;
	font_effects.list.reserve(font_effect_string_list.size());

	// Get or instance each decorator in the comma-separated string list
	for (const String& font_effect_string : font_effect_string_list)
	{
		const size_t shorthand_open = font_effect_string.find('(');
		const size_t shorthand_close = font_effect_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);

		if (invalid_parenthesis)
		{
			// We found no parenthesis, font-effects can only be declared anonymously for now.
			Log::Message(Log::LT_WARNING, "Invalid syntax for font-effect '%s'.", font_effect_string.c_str());
			return false;
		}
		else
		{
			// Since we have parentheses it must be an anonymous decorator with inline properties
			const String type = StringUtilities::StripWhitespace(font_effect_string.substr(0, shorthand_open));

			// Check for valid font-effect type
			FontEffectInstancer* instancer = Factory::GetFontEffectInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Font-effect type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = font_effect_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'font-effect' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "font-effect", shorthand))
			{
				// Empty values are allowed in font-effects, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
				{
					Log::Message(Log::LT_WARNING, "Could not parse font-effect value '%s'.", font_effect_string.c_str());
					return false;
				}
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			RMLUI_ZoneScopedN("InstanceFontEffect");
			SharedPtr<FontEffect> font_effect = instancer->InstanceFontEffect(type, properties);
			if (font_effect)
			{
				// Create a unique hash value for the given type and values
				size_t fingerprint = Hash<String>{}(type);
				for (const auto& id_value : properties.GetProperties())
					Utilities::HashCombine(fingerprint, id_value.second.Get<String>());

				font_effect->SetFingerprint(fingerprint);

				font_effects.list.emplace_back(std::move(font_effect));
			}
			else
			{
				Log::Message(Log::LT_WARNING, "Font-effect '%s' could not be instanced.", font_effect_string.c_str());
				return false;
			}
		}
	}

	if (font_effects.list.empty())
		return false;

	// Partition the list such that the back layer effects appear before the front layer effects
	std::stable_partition(font_effects.list.begin(), font_effects.list.end(),
		[](const SharedPtr<const FontEffect>& effect) { return effect->GetLayer() == FontEffect::Layer::Back; });

	property.value = Variant(MakeShared<FontEffects>(std::move(font_effects)));
	property.unit = Unit::FONTEFFECT;

	return true;
}